

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkeysequenceedit.cpp
# Opt level: O1

bool __thiscall QKeySequenceEdit::event(QKeySequenceEdit *this,QEvent *e)

{
  long lVar1;
  uint *puVar2;
  short sVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  uint uVar7;
  long extraout_RDX;
  long lVar8;
  long lVar9;
  
  sVar3 = *(short *)(e + 8);
  if (sVar3 != 6) {
    if (sVar3 == 0x75) {
      return true;
    }
    if (sVar3 == 0x33) {
      e[0xc] = (QEvent)0x1;
      return true;
    }
    goto LAB_0041479d;
  }
  lVar4 = *(long *)(this + 8);
  uVar7 = QKeyEvent::modifiers();
  lVar5 = *(long *)(lVar4 + 0x298);
  if (lVar5 == 0) {
LAB_00414790:
    lVar8 = -1;
  }
  else {
    lVar8 = extraout_RDX;
    lVar9 = -4;
    do {
      lVar1 = lVar5 * -4 + lVar9;
      if (lVar1 == -4) goto LAB_0041478a;
      lVar8 = lVar9 + 4;
      puVar2 = (uint *)(*(long *)(lVar4 + 0x290) + 4 + lVar9);
      lVar9 = lVar8;
    } while (*puVar2 != (uVar7 | *(uint *)(e + 0x40)));
    lVar8 = lVar8 >> 2;
LAB_0041478a:
    if (lVar1 == -4) goto LAB_00414790;
  }
  if (lVar8 == -1) {
    (**(code **)(*(long *)this + 0xc0))(this,e);
    return true;
  }
LAB_0041479d:
  bVar6 = QWidget::event((QWidget *)this,e);
  return bVar6;
}

Assistant:

bool QKeySequenceEdit::event(QEvent *e)
{
    Q_D(const QKeySequenceEdit);

    switch (e->type()) {
    case QEvent::Shortcut:
        return true;
    case QEvent::ShortcutOverride:
        e->accept();
        return true;
    case QEvent::KeyPress: {
            QKeyEvent *ke = static_cast<QKeyEvent *>(e);
            if (!d->finishingKeyCombinations.contains(ke->keyCombination())) {
                keyPressEvent(ke);
                return true;
            }
        }
        break;
    default:
        break;
    }

    return QWidget::event(e);
}